

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_storage_cmov(secp256k1_fe_storage *r,secp256k1_fe_storage *a,int flag)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  int vflag;
  uint64_t mask1;
  uint64_t mask0;
  int flag_local;
  secp256k1_fe_storage *a_local;
  secp256k1_fe_storage *r_local;
  
  uVar1 = (long)flag - 1;
  uVar2 = uVar1 ^ 0xffffffffffffffff;
  r->n[0] = r->n[0] & uVar1 | a->n[0] & uVar2;
  r->n[1] = r->n[1] & uVar1 | a->n[1] & uVar2;
  r->n[2] = r->n[2] & uVar1 | a->n[2] & uVar2;
  r->n[3] = r->n[3] & uVar1 | a->n[3] & uVar2;
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_fe_storage_cmov(secp256k1_fe_storage *r, const secp256k1_fe_storage *a, int flag) {
    uint64_t mask0, mask1;
    volatile int vflag = flag;
    SECP256K1_CHECKMEM_CHECK_VERIFY(r->n, sizeof(r->n));
    mask0 = vflag + ~((uint64_t)0);
    mask1 = ~mask0;
    r->n[0] = (r->n[0] & mask0) | (a->n[0] & mask1);
    r->n[1] = (r->n[1] & mask0) | (a->n[1] & mask1);
    r->n[2] = (r->n[2] & mask0) | (a->n[2] & mask1);
    r->n[3] = (r->n[3] & mask0) | (a->n[3] & mask1);
}